

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::mouseMoveEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  SwitchPrivate *pSVar3;
  uint uVar4;
  QPoint in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QRect local_4c;
  QRect local_3c;
  QPoint local_2c;
  QPoint local_24;
  int local_1c;
  QMouseEvent *pQStack_18;
  int delta;
  QMouseEvent *event_local;
  Switch *this_local;
  
  __fd = (int)event;
  pQStack_18 = event;
  event_local = (QMouseEvent *)this;
  pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  __addr = extraout_RDX;
  if ((pSVar3->leftMouseButtonPressed & 1U) != 0) {
    local_24 = QMouseEvent::pos(pQStack_18);
    iVar1 = QPoint::x(&local_24);
    pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    iVar2 = QPoint::x(&pSVar3->mousePos);
    local_1c = iVar1 - iVar2;
    pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar3->offset = (iVar1 - iVar2) + pSVar3->offset;
    iVar1 = qAbs<int>(&local_1c);
    pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar3->mouseMoveDelta = iVar1 + pSVar3->mouseMoveDelta;
    local_2c = QMouseEvent::pos(pQStack_18);
    pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    pSVar3->mousePos = local_2c;
    in_RCX = local_2c;
    pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    if (pSVar3->offset < 0) {
      pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
               ::operator->(&this->d);
      pSVar3->offset = 0;
    }
    else {
      pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
               ::operator->(&this->d);
      iVar1 = pSVar3->offset;
      local_3c = QWidget::rect(&this->super_QWidget);
      iVar2 = QRect::width(&local_3c);
      pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
               ::operator->(&this->d);
      uVar4 = (iVar2 + pSVar3->radius * -2) - 2;
      if ((int)uVar4 < iVar1) {
        local_4c = QWidget::rect(&this->super_QWidget);
        iVar1 = QRect::width(&local_4c);
        pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        uVar4 = (iVar1 + pSVar3->radius * -2) - 2;
        pSVar3 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
                 ::operator->(&this->d);
        pSVar3->offset = uVar4;
      }
      in_RCX.yp = 0;
      in_RCX.xp = uVar4;
    }
    QWidget::update();
    __addr = extraout_RDX_00;
  }
  QEvent::accept((QEvent *)pQStack_18,__fd,__addr,(socklen_t *)in_RCX);
  return;
}

Assistant:

void
Switch::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().x() - d->mousePos.x();
		d->offset += delta;
		d->mouseMoveDelta += qAbs( delta );
		d->mousePos = event->pos();

		if( d->offset < 0 )
			d->offset = 0;
		else if( d->offset > rect().width() - d->radius * 2 - 2 )
			d->offset = rect().width() - d->radius * 2 - 2;

		update();
	}

	event->accept();
}